

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwshandshake.hpp
# Opt level: O2

void WebSocketHandshakeKeyGen::Sha1Loop<4>::f<1>(uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = b[1] ^ b[6] ^ b[0xb] ^ b[9];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[9] = uVar2;
  uVar1 = a[4];
  a[1] = a[1] + (*a << 5 | *a >> 0x1b) + uVar2 + (a[3] & uVar1 | (a[3] | uVar1) & a[2]) + 0x8f1bbcdc
  ;
  a[4] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

static inline uint32_t rol(uint32_t value, size_t bits) {return (value << bits) | (value >> (32 - bits));}